

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O0

array * json::array::parse(Pig *pig)

{
  bool bVar1;
  Pig *this;
  string *psVar2;
  size_type sVar3;
  allocator<char> local_89;
  string local_88;
  undefined1 local_62;
  allocator<char> local_61;
  string local_60;
  value_type local_40;
  value *value;
  Pig *local_28;
  array *arr;
  size_type checkpoint;
  Pig *pig_local;
  
  checkpoint = (size_type)pig;
  arr = (array *)Pig::cursor(pig);
  Pig::skipWS((Pig *)checkpoint);
  bVar1 = Pig::skip((Pig *)checkpoint,0x5b);
  if (bVar1) {
    Pig::skipWS((Pig *)checkpoint);
    this = (Pig *)operator_new(0x20);
    array((array *)this);
    local_28 = this;
    local_40 = json::value::parse((Pig *)checkpoint);
    if (local_40 != (value *)0x0) {
      std::vector<json::value_*,_std::allocator<json::value_*>_>::push_back
                ((vector<json::value_*,_std::allocator<json::value_*>_> *)
                 &(local_28->_text).
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,&local_40);
      local_40 = (value *)0x0;
      Pig::skipWS((Pig *)checkpoint);
      while (bVar1 = Pig::skip((Pig *)checkpoint,0x2c), bVar1) {
        Pig::skipWS((Pig *)checkpoint);
        local_40 = json::value::parse((Pig *)checkpoint);
        if (local_40 == (value *)0x0) {
          if (local_28 != (Pig *)0x0) {
            (*(code *)((local_28->_text).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_M_string_length)();
          }
          local_62 = 1;
          psVar2 = (string *)__cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_60,"Error: missing value after \',\' at position {1}",
                     &local_61);
          sVar3 = Pig::cursor((Pig *)checkpoint);
          format<int>(psVar2,&local_60,(int)sVar3);
          local_62 = 0;
          __cxa_throw(psVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        std::vector<json::value_*,_std::allocator<json::value_*>_>::push_back
                  ((vector<json::value_*,_std::allocator<json::value_*>_> *)
                   &(local_28->_text).
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,&local_40);
        Pig::skipWS((Pig *)checkpoint);
      }
    }
    bVar1 = Pig::skip((Pig *)checkpoint,0x5d);
    if (!bVar1) {
      psVar2 = (string *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"Error: missing \']\' at position {1}",&local_89);
      sVar3 = Pig::cursor((Pig *)checkpoint);
      format<int>(psVar2,&local_88,(int)sVar3);
      __cxa_throw(psVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    pig_local = local_28;
  }
  else {
    Pig::restoreTo((Pig *)checkpoint,(size_type)arr);
    pig_local = (Pig *)0x0;
  }
  return (array *)pig_local;
}

Assistant:

json::array* json::array::parse (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  pig.skipWS ();
  if (pig.skip ('['))
  {
    pig.skipWS ();

    auto arr = new json::array ();

    json::value* value;
    if ((value = json::value::parse (pig)))
    {
      arr->_data.push_back (value);
      value = nullptr; // Not a leak.  Looks like a leak.
      pig.skipWS ();
      while (pig.skip (','))
      {
        pig.skipWS ();

        if ((value = json::value::parse (pig)))
        {
          arr->_data.push_back (value);
          pig.skipWS ();
        }
        else
        {
          delete arr;
          throw format ("Error: missing value after ',' at position {1}", (int) pig.cursor ());
        }
      }
    }

    if (pig.skip (']'))
      return arr;
    else
      throw format ("Error: missing ']' at position {1}", (int) pig.cursor ());

    delete arr;
  }

  pig.restoreTo (checkpoint);
  return nullptr;
}